

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O1

void MaxDiffsForRow(int width,int stride,uint32_t *argb,uint8_t *max_diffs,int used_subtract_green)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint p1;
  uint p2;
  uint p2_00;
  uint p2_01;
  uint p2_02;
  long lVar6;
  
  if (2 < width) {
    p2_01 = *argb;
    p1 = argb[1];
    if (used_subtract_green != 0) {
      p2_01 = p2_01 & 0xff00ff00 |
              (p2_01 >> 8) * 0x10000 + (p2_01 & 0xff00ff) + (p2_01 >> 8 & 0xff) & 0xff00ff;
      p1 = p1 & 0xff00ff00 | (p1 >> 8) * 0x10000 + (p1 & 0xff00ff) + (p1 >> 8 & 0xff) & 0xff00ff;
    }
    iVar5 = 3;
    if (3 < width) {
      iVar5 = width;
    }
    lVar6 = 0;
    do {
      p2_00 = argb[(1 - stride) + (int)lVar6];
      p2_02 = argb[(long)stride + lVar6 + 1];
      p2 = argb[lVar6 + 2];
      if (used_subtract_green != 0) {
        p2_00 = p2_00 & 0xff00ff00 |
                (p2_00 >> 8) * 0x10000 + (p2_00 & 0xff00ff) + (p2_00 >> 8 & 0xff) & 0xff00ff;
        p2_02 = p2_02 & 0xff00ff00 |
                (p2_02 >> 8) * 0x10000 + (p2_02 & 0xff00ff) + (p2_02 >> 8 & 0xff) & 0xff00ff;
        p2 = p2 & 0xff00ff00 | (p2 >> 8) * 0x10000 + (p2 & 0xff00ff) + (p2 >> 8 & 0xff) & 0xff00ff;
      }
      iVar1 = MaxDiffBetweenPixels(p1,p2_00);
      iVar2 = MaxDiffBetweenPixels(p1,p2_02);
      iVar3 = MaxDiffBetweenPixels(p1,p2_01);
      iVar4 = MaxDiffBetweenPixels(p1,p2);
      if (iVar2 < iVar1) {
        iVar2 = iVar1;
      }
      if (iVar4 < iVar3) {
        iVar4 = iVar3;
      }
      if (iVar4 < iVar2) {
        iVar4 = iVar2;
      }
      max_diffs[lVar6 + 1] = (uint8_t)iVar4;
      lVar6 = lVar6 + 1;
      p2_01 = p1;
      p1 = p2;
    } while ((ulong)(iVar5 - 1) - 1 != lVar6);
  }
  return;
}

Assistant:

static void MaxDiffsForRow(int width, int stride, const uint32_t* const argb,
                           uint8_t* const max_diffs, int used_subtract_green) {
  uint32_t current, up, down, left, right;
  int x;
  if (width <= 2) return;
  current = argb[0];
  right = argb[1];
  if (used_subtract_green) {
    current = AddGreenToBlueAndRed(current);
    right = AddGreenToBlueAndRed(right);
  }
  // max_diffs[0] and max_diffs[width - 1] are never used.
  for (x = 1; x < width - 1; ++x) {
    up = argb[-stride + x];
    down = argb[stride + x];
    left = current;
    current = right;
    right = argb[x + 1];
    if (used_subtract_green) {
      up = AddGreenToBlueAndRed(up);
      down = AddGreenToBlueAndRed(down);
      right = AddGreenToBlueAndRed(right);
    }
    max_diffs[x] = MaxDiffAroundPixel(current, up, down, left, right);
  }
}